

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverAppTest_StandardOptions_Test::~SolverAppTest_StandardOptions_Test
          (SolverAppTest_StandardOptions_Test *this)

{
  void *in_RDI;
  
  ~SolverAppTest_StandardOptions_Test((SolverAppTest_StandardOptions_Test *)0x165478);
  operator_delete(in_RDI,0x5f8);
  return;
}

Assistant:

TEST_F(SolverAppTest, StandardOptions) {
  mp::OptionList &options = app_.options();
  options.Sort();
  char std_options[] = {'-', '=', '?', 'e', 's', 'v'};
  for (std::size_t i = 0, n = sizeof(std_options); i < n; ++i) {
    char opt = std_options[i];
    EXPECT_TRUE(options.Find(opt) != 0) << "option -" << opt;
  }
}